

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O3

callback_t *
begin_property_state
          (callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  undefined8 *puVar1;
  QTextStream *pQVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  int iVar3;
  undefined8 *puVar4;
  QDebug *pQVar5;
  MetaProperty *__tmp;
  bool bVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  initializer_list<char> __l;
  string property_name;
  undefined2 local_98;
  undefined6 uStack_96;
  QString local_90;
  allocator_type local_71;
  string local_70;
  string local_50;
  
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  clear_empty(f);
  anon_unknown.dwarf_22726::trim((string *)&(anonymous_namespace)::global_string_abi_cxx11_);
  puVar4 = (undefined8 *)operator_new(0xb8);
  puVar4[1] = 0x100000001;
  *puVar4 = &PTR___Sp_counted_ptr_inplace_00117ce8;
  puVar1 = puVar4 + 2;
  memset(puVar1,0,0xa8);
  puVar4[4] = puVar4 + 6;
  puVar4[8] = puVar4 + 10;
  puVar4[0xc] = puVar4 + 0xe;
  puVar4[0x13] = puVar4 + 0x11;
  puVar4[0x14] = puVar4 + 0x11;
  this = DAT_001182f0;
  bVar6 = DAT_001182f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (anonymous_namespace)::current_property = puVar1;
  DAT_001182f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar4;
  if (bVar6) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  iVar3 = std::__cxx11::string::compare((char *)&(anonymous_namespace)::global_string_abi_cxx11_);
  if (iVar3 == 0) {
    *(undefined1 *)((anonymous_namespace)::current_property + 0x14) = 1;
    std::operator>>((istream *)f,(string *)&(anonymous_namespace)::global_string_abi_cxx11_);
    parser();
    if ((parser()::category[0x10] & 1) != 0) {
      parser();
      local_50._M_dataplus._M_p._0_4_ = 2;
      local_50._M_dataplus._M_p._4_4_ = 0;
      local_50._M_string_length._0_4_ = 0;
      local_50._M_string_length._4_4_ = 0;
      local_50.field_2._M_allocated_capacity._0_4_ = 0;
      local_50.field_2._M_allocated_capacity._4_4_ = 0;
      local_50.field_2._8_8_ = parser()::category._8_8_;
      QMessageLogger::debug();
      pQVar2 = (QTextStream *)CONCAT62(uStack_96,local_98);
      QVar7.m_data = (storage_type *)0xe;
      QVar7.m_size = (qsizetype)&local_90;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<(pQVar2,&local_90);
      if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,8);
        }
      }
      if (((QTextStream *)CONCAT62(uStack_96,local_98))[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)CONCAT62(uStack_96,local_98),' ');
      }
      operator<<((QDebug *)&local_98,(string *)&(anonymous_namespace)::global_string_abi_cxx11_);
      QDebug::~QDebug((QDebug *)&local_98);
    }
  }
  std::__cxx11::string::_M_assign((string *)((anonymous_namespace)::current_property + 10));
  puVar1 = (anonymous_namespace)::current_property;
  *(anonymous_namespace)::current_property = (anonymous_namespace)::current_class;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1),
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&DAT_00118300);
  DAT_00118310 = 0;
  *(anonymous_namespace)::global_string_abi_cxx11_ = 0;
  local_98 = 0xa3d;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_98;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_90,__l,&local_71);
  read_untill_delimiters_abi_cxx11_(&local_50,f,(vector<char,_std::allocator<char>_> *)&local_90);
  std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_),
                    CONCAT44(local_50.field_2._M_allocated_capacity._4_4_,
                             local_50.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    operator_delete(local_90.d.d,local_90.d.size - (long)local_90.d.d);
  }
  anon_unknown.dwarf_22726::trim(&local_70);
  std::__cxx11::string::_M_assign((string *)((anonymous_namespace)::current_property + 2));
  parser();
  if ((parser()::category[0x10] & 1) != 0) {
    parser();
    local_50._M_dataplus._M_p._0_4_ = 2;
    local_50._M_dataplus._M_p._4_4_ = 0;
    local_50._M_string_length._0_4_ = 0;
    local_50._M_string_length._4_4_ = 0;
    local_50.field_2._M_allocated_capacity._0_4_ = 0;
    local_50.field_2._M_allocated_capacity._4_4_ = 0;
    local_50.field_2._8_8_ = parser()::category._8_8_;
    QMessageLogger::debug();
    pQVar2 = (QTextStream *)CONCAT62(uStack_96,local_98);
    QVar8.m_data = (storage_type *)0x12;
    QVar8.m_size = (qsizetype)&local_90;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<(pQVar2,&local_90);
    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,8);
      }
    }
    if (((QTextStream *)CONCAT62(uStack_96,local_98))[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)CONCAT62(uStack_96,local_98),' ');
    }
    pQVar5 = operator<<((QDebug *)&local_98,&local_70);
    pQVar2 = *(QTextStream **)pQVar5;
    QVar9.m_data = (storage_type *)0x1;
    QVar9.m_size = (qsizetype)&local_90;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<(pQVar2,&local_90);
    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,8);
      }
    }
    if ((*(QTextStream **)pQVar5)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)pQVar5,' ');
    }
    QDebug::~QDebug((QDebug *)&local_98);
  }
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = property_state;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_manager;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

callback_t begin_property_state(MetaConfiguration &conf, std::ifstream &f,
                                int &error) {
  // here we know that we have at least the type of the property,
  // but it can be three kinds of string.

  std::string property_name;
  clear_empty(f);

  trim(global_string);
  current_property = std::make_shared<MetaProperty>();

  if (global_string == "enum") {
    current_property->is_enum = true;
    f >> global_string;
    qCDebug(parser) << "Enum with type" << global_string;
  }

  current_property->type = global_string;
  current_property->parent = current_class;
  global_string.clear();

  // find the name of the property
  property_name = read_untill_delimiters(f, {'=', '\n'});
  trim(property_name);
  current_property->name = property_name;
  qCDebug(parser) << "Starting property " << property_name << " ";
  return property_state;
}